

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  char *pcVar5;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  bVar1 = UnitTestImpl::Passed(unit_test->impl_);
  pcVar5 = "0";
  if (bVar1) {
    pcVar5 = "1";
  }
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = "";
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar5,pcVar4);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x158ca2);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_58.field_2._M_allocated_capacity = *psVar3;
    local_58.field_2._8_8_ = plVar2[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar3;
    local_58._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_58._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  AbstractSocketWriter::SendLn
            ((this->socket_writer_)._M_t.
             super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             .
             super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>
             ._M_head_impl,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  (*((this->socket_writer_)._M_t.
     super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
     ._M_t.
     super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
     .super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>.
    _M_head_impl)->_vptr_AbstractSocketWriter[3])();
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) override {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    SendLn("event=TestProgramEnd&passed=" + FormatBool(unit_test.Passed()));

    // Notify the streaming server to stop.
    socket_writer_->CloseConnection();
  }